

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

void __thiscall QFormLayoutPrivate::~QFormLayoutPrivate(QFormLayoutPrivate *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  *(undefined ***)&this->super_QLayoutPrivate = &PTR__QFormLayoutPrivate_007fa6f0;
  pDVar1 = (this->hfwLayouts).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->hfwLayouts).d.d)->super_QArrayData,0x20,0x10);
    }
  }
  pDVar1 = (this->vLayouts).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->vLayouts).d.d)->super_QArrayData,0x20,0x10);
    }
  }
  pDVar2 = (this->m_things).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_things).d.d)->super_QArrayData,8,0x10);
    }
  }
  pDVar2 = (this->m_matrix).m_storage.d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate(&((this->m_matrix).m_storage.d.d)->super_QArrayData,8,0x10);
    }
  }
  QObjectPrivate::~QObjectPrivate((QObjectPrivate *)this);
  return;
}

Assistant:

~QFormLayoutPrivate() { }